

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadBodyMesh.cpp
# Opt level: O2

void __thiscall chrono::ChLoadBodyMesh::LoadGetStateBlock_w(ChLoadBodyMesh *this,ChStateDelta *mD)

{
  pointer psVar1;
  long *plVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ChStateDelta mDi;
  ChStateDelta local_80;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  lVar6 = 0;
  uVar5 = 0;
  iVar4 = 0;
  while( true ) {
    psVar1 = (this->forces).
             super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->forces).
                      super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar5)
    break;
    iVar3 = (**(code **)(**(long **)((long)&(psVar1->
                                            super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar6) + 0x38))();
    ChStateDelta::ChStateDelta(&local_80,(long)iVar3,(ChIntegrable *)0x0);
    plVar2 = *(long **)((long)&(((this->forces).
                                 super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar6);
    (**(code **)(*plVar2 + 0x48))(plVar2,&local_80);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,&mD->super_ChVectorDynamic<double>,(long)iVar4,
               local_80.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&local_68.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               &local_80.super_ChVectorDynamic<double>);
    iVar3 = (**(code **)(**(long **)((long)&(((this->forces).
                                              super__Vector_base<std::shared_ptr<chrono::ChLoadBodyForce>,_std::allocator<std::shared_ptr<chrono::ChLoadBodyForce>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super___shared_ptr<chrono::ChLoadBodyForce,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar6) + 0x38))();
    iVar4 = iVar4 + iVar3;
    Eigen::internal::handmade_aligned_free
              (local_80.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x10;
  }
  return;
}

Assistant:

void ChLoadBodyMesh::LoadGetStateBlock_w(ChStateDelta& mD) {
    int ndoftot = 0;
    for (int i = 0; i < forces.size(); ++i) {
        ChStateDelta mDi(forces[i]->LoadGet_ndof_w(), nullptr);
        forces[i]->LoadGetStateBlock_w(mDi);
        mD.segment(ndoftot, mDi.size()) = mDi;
        ndoftot += forces[i]->LoadGet_ndof_w();
    }
}